

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O3

void nni_http_conn_reset(nng_http *conn)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  
  nni_http_req_reset(&conn->req);
  nni_http_res_reset(&conn->res);
  builtin_strncpy(conn->meth,"GET",4);
  if (conn->host[0] != '\0') {
    nni_list_node_remove(&(conn->host_header).node);
    (conn->host_header).name = "Host";
    (conn->host_header).value = conn->host;
    (conn->host_header).field_0x20 = (conn->host_header).field_0x20 & 0xf8 | 3;
    nni_list_prepend(&(conn->req).data.hdrs,&conn->host_header);
  }
  pcVar3 = conn->uri;
  if (pcVar3 != conn->ubuf && pcVar3 != (char *)0x0) {
    nni_strfree(pcVar3);
  }
  conn->uri = (char *)0x0;
  lVar2 = 1;
  pcVar3 = "HTTP/1.1";
  do {
    iVar1 = strcmp("HTTP/1.1",pcVar3);
    if (iVar1 == 0) {
      conn->vers = pcVar3;
      break;
    }
    pcVar3 = nni_http_set_version::http_versions[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 6);
  conn->code = 0;
  nni_strfree(conn->rsn);
  conn->rsn = (char *)0x0;
  return;
}

Assistant:

void
nni_http_conn_reset(nng_http *conn)
{
	nni_http_req_reset(&conn->req);
	nni_http_res_reset(&conn->res);
	(void) snprintf(conn->meth, sizeof(conn->meth), "GET");
	if (strlen(conn->host)) {
		nni_http_set_host(conn, conn->host);
	}
	if (conn->uri != NULL && conn->uri != conn->ubuf) {
		nni_strfree(conn->uri);
	}
	conn->uri = NULL;
	nni_http_set_version(conn, NNG_HTTP_VERSION_1_1);
	nni_http_set_status(conn, 0, NULL);
}